

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# moc_qnetworkaccesscache_p.cpp
# Opt level: O3

int __thiscall QNetworkAccessCache::qt_metacall(QNetworkAccessCache *this,Call _c,int _id,void **_a)

{
  int iVar1;
  undefined4 in_register_00000014;
  QNetworkAccessCache *_t;
  long in_FS_OFFSET;
  undefined8 local_40;
  void *local_38;
  undefined8 *local_30;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  iVar1 = QObject::qt_metacall((Call)this,_c,(void **)CONCAT44(in_register_00000014,_id));
  if (-1 < iVar1) {
    if (_c == RegisterMethodArgumentMetaType) {
      if (iVar1 == 0) {
        *(undefined8 *)*_a = 0;
      }
    }
    else {
      if (_c != InvokeMetaMethod) goto LAB_0017b42c;
      if (iVar1 == 0) {
        local_40 = *_a[1];
        local_30 = &local_40;
        local_38 = (void *)0x0;
        QMetaObject::activate((QObject *)this,&staticMetaObject,0,&local_38);
      }
    }
    iVar1 = iVar1 + -1;
  }
LAB_0017b42c:
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return iVar1;
  }
  __stack_chk_fail();
}

Assistant:

int QNetworkAccessCache::qt_metacall(QMetaObject::Call _c, int _id, void **_a)
{
    _id = QObject::qt_metacall(_c, _id, _a);
    if (_id < 0)
        return _id;
    if (_c == QMetaObject::InvokeMetaMethod) {
        if (_id < 1)
            qt_static_metacall(this, _c, _id, _a);
        _id -= 1;
    }
    if (_c == QMetaObject::RegisterMethodArgumentMetaType) {
        if (_id < 1)
            *reinterpret_cast<QMetaType *>(_a[0]) = QMetaType();
        _id -= 1;
    }
    return _id;
}